

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O2

void __thiscall
ScriptUtil_CreatePegoutLogkingScriptTest_Test::ScriptUtil_CreatePegoutLogkingScriptTest_Test
          (ScriptUtil_CreatePegoutLogkingScriptTest_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005c46b8;
  return;
}

Assistant:

TEST(ScriptUtil, CreatePegoutLogkingScriptTest) {
  std::vector<PegoutTestVector> test_vectors = {
    {
      BlockHash(),
      Script(),
      Pubkey(),
      ByteData(),
      Script("6a0000"),
    },
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487"),
      Pubkey("03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c"),
      ByteData("01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4872103d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
    },
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
      Pubkey("03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c"),
      ByteData("01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a4372103d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
    },
    // invalid Pubkey
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
      Pubkey(),
      ByteData("01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
    },
    // empty whitelist proof
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
      Pubkey("03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c"),
      ByteData(),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
    },
    // invalid Pubkey and empty whitelist proof
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
      Pubkey(),
      ByteData(),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
    },
  };

  Script actual;
  for (PegoutTestVector test_vector : test_vectors) {
    EXPECT_NO_THROW((actual = ScriptUtil::CreatePegoutLogkingScript(test_vector.genesisblock_hash, test_vector.parent_locking_script, test_vector.btc_pubkey_bytes, test_vector.whitelist_proof)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_script.GetHex().c_str());
  }
}